

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GyroscopeSensor.cpp
# Opt level: O0

void __thiscall iDynTree::GyroscopeSensor::~GyroscopeSensor(GyroscopeSensor *this)

{
  undefined8 *in_RDI;
  GyroscopePrivateAttributes *this_00;
  
  *in_RDI = &PTR__GyroscopeSensor_004fa9d8;
  this_00 = (GyroscopePrivateAttributes *)in_RDI[1];
  if (this_00 != (GyroscopePrivateAttributes *)0x0) {
    GyroscopePrivateAttributes::~GyroscopePrivateAttributes(this_00);
    operator_delete(this_00,0xa8);
  }
  LinkSensor::~LinkSensor((LinkSensor *)0x48a161);
  return;
}

Assistant:

GyroscopeSensor::~GyroscopeSensor()
{
    delete this->pimpl;
}